

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

size_t parse_uric(char *in,size_t max,token *out)

{
  char in_00;
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  
  for (sVar4 = 0; sVar3 = max, max != sVar4; sVar4 = sVar4 + 1) {
    in_00 = in[sVar4];
    iVar1 = is_unreserved(in_00);
    if (((iVar1 == 0) && (pvVar2 = memchr(";/?:@&=+$,{}",(int)in_00,0xd), pvVar2 == (void *)0x0)) &&
       ((sVar3 = sVar4, max <= sVar4 + 2 || (iVar1 = is_escaped(in + sVar4), iVar1 == 0)))) break;
  }
  out->size = sVar3;
  out->buff = in;
  return sVar3;
}

Assistant:

static size_t parse_uric(
	/*! [in] String of characters. */
	const char *in,
	/*! [in] Maximum limit. */
	size_t max,
	/*! [out] Token object where the string of characters is copied. */
	token *out)
{
	size_t i = (size_t)0;

	while (i < max &&
		(is_unreserved(in[i]) || is_reserved(in[i]) ||
			((i + (size_t)2 < max) && is_escaped(&in[i])))) {
		i++;
	}

	out->size = i;
	out->buff = in;
	return i;
}